

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromise.cpp
# Opt level: O0

void __thiscall
tst_deprecations_helpers_qpromise::copyLValue(tst_deprecations_helpers_qpromise *this)

{
  Data *this_00;
  Logs *pLVar1;
  ulong uVar2;
  QPromise<Data> local_38;
  undefined1 local_28 [8];
  QPromise<Data> p;
  Data_conflict value;
  tst_deprecations_helpers_qpromise *this_local;
  
  pLVar1 = Logger::logs();
  Logs::reset(pLVar1);
  this_00 = (Data *)((long)&p.super_QPromiseBase<Data>.m_d.d + 4);
  Data::Data(this_00,0x2a);
  QtPromise::qPromise<Data&>((QtPromise *)&local_38,(Data_conflict *)this_00);
  QtPromise::QPromiseBase<Data>::wait((QPromiseBase<Data> *)local_28,&local_38);
  QtPromise::QPromise<Data>::~QPromise(&local_38);
  QtPromise::QPromise<Data>::~QPromise((QPromise<Data> *)local_28);
  Data::~Data((Data *)((long)&p.super_QPromiseBase<Data>.m_d.d + 4));
  pLVar1 = Logger::logs();
  uVar2 = QTest::qCompare(pLVar1->ctor,1,"Data::logs().ctor","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromise.cpp"
                          ,0x5f);
  if ((uVar2 & 1) != 0) {
    pLVar1 = Logger::logs();
    uVar2 = QTest::qCompare(pLVar1->copy,1,"Data::logs().copy","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromise.cpp"
                            ,0x60);
    if ((uVar2 & 1) != 0) {
      pLVar1 = Logger::logs();
      uVar2 = QTest::qCompare(pLVar1->move,0,"Data::logs().move","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromise.cpp"
                              ,0x61);
      if ((uVar2 & 1) != 0) {
        pLVar1 = Logger::logs();
        QTest::qCompare(pLVar1->refs,0,"Data::logs().refs","0",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromise.cpp"
                        ,0x62);
      }
    }
  }
  return;
}

Assistant:

void tst_deprecations_helpers_qpromise::copyLValue()
{
    Data::logs().reset();

    {
        Data value{42};
        auto p = QtPromise::qPromise(value).wait();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<Data>>::value));
    }

    QCOMPARE(Data::logs().ctor, 1);
    QCOMPARE(Data::logs().copy, 1);
    QCOMPARE(Data::logs().move, 0);
    QCOMPARE(Data::logs().refs, 0);
}